

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuImage.cpp
# Opt level: O0

int createBoxConstraints
              (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               *coverMatrix,int header)

{
  reference this;
  reference local_40;
  int local_2c;
  int local_28;
  int index;
  int columnDelta;
  int rowDelta;
  int n;
  int column;
  int row;
  int header_local;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *coverMatrix_local;
  
  column = header;
  _row = coverMatrix;
  for (n = 1; n < 10; n = n + 3) {
    for (rowDelta = 1; rowDelta < 10; rowDelta = rowDelta + 3) {
      for (columnDelta = 1; columnDelta < 10; columnDelta = columnDelta + 1) {
        for (index = 0; index < 3; index = index + 1) {
          for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
            local_2c = indexInCoverMatrix(n + index,rowDelta + local_28,columnDelta);
            this = std::
                   vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   ::operator[](_row,(long)local_2c);
            local_40 = std::vector<bool,_std::allocator<bool>_>::operator[](this,(long)column);
            std::_Bit_reference::operator=(&local_40,true);
          }
        }
        column = column + 1;
      }
    }
  }
  return column;
}

Assistant:

int createBoxConstraints(vector<vector<bool> > &coverMatrix, int header){
    for (int row = COVER_START_INDEX; row <= SIZE; row += BOX_SIZE) {
      for (int column = COVER_START_INDEX; column <= SIZE; column += BOX_SIZE) {
        for (int n = COVER_START_INDEX; n <= SIZE; n++, header++) {
          for (int rowDelta = 0; rowDelta < BOX_SIZE; rowDelta++) {
            for (int columnDelta = 0; columnDelta < BOX_SIZE; columnDelta++) {
              int index = indexInCoverMatrix(row + rowDelta, column + columnDelta, n);
              //matrix[index][header] = 1;
              coverMatrix[index][header] = true;
            }
          }
        }
      }
    }
    return header;
}